

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

void onlyRightProcessMemoryTemps
               (AssemblyCommands *newAssemblyCommands,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *spilledToOffset,CTemp *beginSP,shared_ptr<AssemblyCode::AssemblyCommand> *thisShared
               ,CTemp *rightOperand)

{
  bool bVar1;
  pointer ppVar2;
  CTemp local_e0;
  undefined1 local_c0 [24];
  CTemp rightTemp;
  CTemp local_78;
  _Self local_58;
  iterator rightFind;
  string rightName;
  CTemp *rightOperand_local;
  shared_ptr<AssemblyCode::AssemblyCommand> *thisShared_local;
  CTemp *beginSP_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *spilledToOffset_local;
  AssemblyCommands *newAssemblyCommands_local;
  
  IRT::CTemp::ToString_abi_cxx11_((CTemp *)&rightFind);
  IRT::CTemp::ToString_abi_cxx11_(&local_78);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(spilledToOffset,&local_78.name);
  std::__cxx11::string::~string((string *)&local_78);
  rightTemp._24_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(spilledToOffset);
  bVar1 = std::operator!=(&local_58,(_Self *)&rightTemp.field_0x18);
  if (bVar1) {
    IRT::CTemp::CTemp((CTemp *)(local_c0 + 0x10));
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_58);
    createLoad((CTemp *)local_c0,(int)local_c0 + 0x10,(CTemp *)(ulong)(uint)ppVar2->second);
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
    ::push_back(newAssemblyCommands,(value_type *)local_c0);
    std::shared_ptr<AssemblyCode::AssemblyCommand>::~shared_ptr
              ((shared_ptr<AssemblyCode::AssemblyCommand> *)local_c0);
    IRT::CTemp::ToString_abi_cxx11_(&local_e0);
    std::__cxx11::string::operator=((string *)&rightFind,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    IRT::CTemp::~CTemp((CTemp *)(local_c0 + 0x10));
  }
  std::
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ::push_back(newAssemblyCommands,thisShared);
  IRT::CTemp::setName(rightOperand,(string *)&rightFind);
  std::__cxx11::string::~string((string *)&rightFind);
  return;
}

Assistant:

void onlyRightProcessMemoryTemps(AssemblyCommands &newAssemblyCommands,
                                 std::map<std::string, int> &spilledToOffset,
                                 IRT::CTemp& beginSP,
                                 std::shared_ptr<AssemblyCode::AssemblyCommand> thisShared,
                                 IRT::CTemp& rightOperand) {

    std::string rightName = rightOperand.ToString();

    auto rightFind = spilledToOffset.find(rightOperand.ToString());

    if (rightFind != spilledToOffset.end()) {
        IRT::CTemp rightTemp;
        newAssemblyCommands.push_back(createLoad(rightTemp, rightFind->second, beginSP));

        rightName = rightTemp.ToString();
    }

    newAssemblyCommands.push_back(thisShared);

    rightOperand.setName(rightName);
}